

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_DeathThink(player_t *player)

{
  APlayerPawn *source;
  bool bVar1;
  BYTE BVar2;
  uint uVar3;
  int iVar4;
  AActor *pAVar5;
  double dVar6;
  bool local_69;
  TAngle<double> local_60;
  TAngle<double> local_58;
  TAngle<double> local_50;
  TFlags<ActorFlag,_unsigned_int> local_44;
  TAngle<double> local_40;
  TAngle<double> local_38;
  TAngle<double> local_30;
  TAngle<double> local_28;
  DAngle lookDelta;
  DAngle delta;
  int dir;
  player_t *player_local;
  
  TAngle<double>::TAngle(&lookDelta);
  player_t::TickPSprites(player);
  dVar6 = AActor::Z(&player->mo->super_AActor);
  player->onground = dVar6 <= (player->mo->super_AActor).floorz;
  bVar1 = DObject::IsKindOf((DObject *)player->mo,APlayerChunk::RegistrationInfo.MyClass);
  if (bVar1) {
    player->viewheight = 6.0;
    player->deltaviewheight = 0.0;
    if (((player->onground & 1U) != 0) &&
       (bVar1 = TAngle<double>::operator>(&(player->mo->super_AActor).Angles.Pitch,-19.0), bVar1)) {
      TAngle<double>::TAngle(&local_38,&(player->mo->super_AActor).Angles.Pitch);
      operator-(-19.0,&local_30);
      TAngle<double>::operator/(&local_28,8.0);
      TAngle<double>::TAngle(&local_40,&local_28);
      TAngle<double>::operator+=(&(player->mo->super_AActor).Angles.Pitch,&local_40);
    }
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_44,
               (int)player->mo +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
    if (uVar3 == 0) {
      player->deltaviewheight = 0.0;
      if (6.0 < player->viewheight) {
        player->viewheight = player->viewheight - 1.0;
      }
      if (player->viewheight <= 6.0 && player->viewheight != 6.0) {
        player->viewheight = 6.0;
      }
      bVar1 = TAngle<double>::operator<(&(player->mo->super_AActor).Angles.Pitch,0.0);
      if (bVar1) {
        TAngle<double>::operator+=(&(player->mo->super_AActor).Angles.Pitch,3.0);
      }
      else {
        bVar1 = TAngle<double>::operator>(&(player->mo->super_AActor).Angles.Pitch,0.0);
        if (bVar1) {
          TAngle<double>::operator-=(&(player->mo->super_AActor).Angles.Pitch,3.0);
        }
      }
      fabs<double>(&local_50);
      bVar1 = TAngle<double>::operator<(&local_50,3.0);
      if (bVar1) {
        TAngle<double>::operator=(&(player->mo->super_AActor).Angles.Pitch,0.0);
      }
    }
  }
  P_CalcHeight(player);
  pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&player->attacker);
  if ((pAVar5 == (AActor *)0x0) ||
     (bVar1 = TObjPtr<AActor>::operator!=(&player->attacker,&player->mo->super_AActor), !bVar1)) {
    if (player->damagecount != 0) {
      player->damagecount = player->damagecount + -1;
    }
    if (player->poisoncount != 0) {
      player->poisoncount = player->poisoncount + -1;
    }
  }
  else {
    source = player->mo;
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&player->attacker);
    iVar4 = P_FaceMobj(&source->super_AActor,pAVar5,&lookDelta);
    bVar1 = TAngle<double>::operator<(&lookDelta,10.0);
    if (bVar1) {
      if (player->damagecount != 0) {
        player->damagecount = player->damagecount + -1;
      }
      if (player->poisoncount != 0) {
        player->poisoncount = player->poisoncount + -1;
      }
    }
    TAngle<double>::operator/=(&lookDelta,8.0);
    bVar1 = TAngle<double>::operator>(&lookDelta,5.0);
    if (bVar1) {
      TAngle<double>::operator=(&lookDelta,5.0);
    }
    if (iVar4 == 0) {
      TAngle<double>::TAngle(&local_60,&lookDelta);
      TAngle<double>::operator-=(&(player->mo->super_AActor).Angles.Yaw,&local_60);
    }
    else {
      TAngle<double>::TAngle(&local_58,&lookDelta);
      TAngle<double>::operator+=(&(player->mo->super_AActor).Angles.Yaw,&local_58);
    }
  }
  if ((((((player->cmd).ucmd.buttons & 2) != 0) ||
       ((((multiplayer & 1U) != 0 ||
         (bVar1 = FBoolCVar::operator_cast_to_bool(&alwaysapplydmflags), bVar1)) &&
        (uVar3 = FIntCVar::operator_cast_to_int(&dmflags), (uVar3 & 0x100) != 0)))) &&
      (uVar3 = FIntCVar::operator_cast_to_int(&dmflags2), (uVar3 & 0x4000) == 0)) &&
     ((player->respawn_time <= level.time ||
      ((((player->cmd).ucmd.buttons & 2) != 0 &&
       (bVar1 = TObjPtr<DBot>::operator==(&player->Bot,(DBot *)0x0), bVar1)))))) {
    player->cls = (PClassPlayerPawn *)0x0;
    local_69 = true;
    if (((multiplayer & 1U) == 0) && (local_69 = true, (level.flags2 & 0x20000) == 0)) {
      local_69 = FBoolCVar::operator_cast_to_bool(&sv_singleplayerrespawn);
    }
    BVar2 = '\x03';
    if (local_69 != false) {
      BVar2 = '\x02';
    }
    player->playerstate = BVar2;
    if (2 < (player->mo->super_AActor).special1) {
      (player->mo->super_AActor).special1 = 0;
    }
  }
  return;
}

Assistant:

void P_DeathThink (player_t *player)
{
	int dir;
	DAngle delta;

	player->TickPSprites();

	player->onground = (player->mo->Z() <= player->mo->floorz);
	if (player->mo->IsKindOf (RUNTIME_CLASS(APlayerChunk)))
	{ // Flying bloody skull or flying ice chunk
		player->viewheight = 6;
		player->deltaviewheight = 0;
		if (player->onground)
		{
			if (player->mo->Angles.Pitch > -19.)
			{
				DAngle lookDelta = (-19. - player->mo->Angles.Pitch) / 8;
				player->mo->Angles.Pitch += lookDelta;
			}
		}
	}
	else if (!(player->mo->flags & MF_ICECORPSE))
	{ // Fall to ground (if not frozen)
		player->deltaviewheight = 0;
		if (player->viewheight > 6)
		{
			player->viewheight -= 1;
		}
		if (player->viewheight < 6)
		{
			player->viewheight = 6;
		}
		if (player->mo->Angles.Pitch < 0)
		{
			player->mo->Angles.Pitch += 3;
		}
		else if (player->mo->Angles.Pitch > 0)
		{
			player->mo->Angles.Pitch -= 3;
		}
		if (fabs(player->mo->Angles.Pitch) < 3)
		{
			player->mo->Angles.Pitch = 0.;
		}
	}
	P_CalcHeight (player);
		
	if (player->attacker && player->attacker != player->mo)
	{ // Watch killer
		dir = P_FaceMobj (player->mo, player->attacker, &delta);
		if (delta < 10)
		{ // Looking at killer, so fade damage and poison counters
			if (player->damagecount)
			{
				player->damagecount--;
			}
			if (player->poisoncount)
			{
				player->poisoncount--;
			}
		}
		delta /= 8;
		if (delta > 5.)
		{
			delta = 5.;
		}
		if (dir)
		{ // Turn clockwise
			player->mo->Angles.Yaw += delta;
		}
		else
		{ // Turn counter clockwise
			player->mo->Angles.Yaw -= delta;
		}
	}
	else
	{
		if (player->damagecount)
		{
			player->damagecount--;
		}
		if (player->poisoncount)
		{
			player->poisoncount--;
		}
	}		

	if ((player->cmd.ucmd.buttons & BT_USE ||
		((multiplayer || alwaysapplydmflags) && (dmflags & DF_FORCE_RESPAWN))) && !(dmflags2 & DF2_NO_RESPAWN))
	{
		if (level.time >= player->respawn_time || ((player->cmd.ucmd.buttons & BT_USE) && player->Bot == NULL))
		{
			player->cls = NULL;		// Force a new class if the player is using a random class
			player->playerstate = 
				(multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN) || sv_singleplayerrespawn)
				? PST_REBORN : PST_ENTER;
			if (player->mo->special1 > 2)
			{
				player->mo->special1 = 0;
			}
		}
	}
}